

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_eigen.hpp
# Opt level: O3

Tensor<2> * Omega_h::exp_spd_old<2>(Tensor<2> m)

{
  Vector<2> *pVVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  undefined8 uVar5;
  double *pdVar6;
  bool bVar7;
  double *pdVar8;
  Tensor<2> *in_RDI;
  long lVar9;
  undefined4 uVar10;
  double dVar11;
  undefined4 uVar13;
  double dVar12;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 in_stack_00000008 [16];
  undefined1 in_stack_00000018 [16];
  Matrix<2,_2> c;
  Vector<2> l;
  Matrix<2,_2> b_1;
  double local_138;
  double dStack_130;
  double local_128 [5];
  double local_100;
  undefined1 local_f8 [8];
  double dStack_f0;
  char *local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_80;
  double local_78;
  undefined1 local_70 [16];
  double local_60;
  
  local_128[0] = in_stack_00000008._0_8_;
  local_128[1] = in_stack_00000008._8_8_;
  local_128[2] = in_stack_00000018._0_8_;
  local_128[3] = in_stack_00000018._8_8_;
  dVar17 = 0.0;
  pdVar6 = local_128;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    lVar9 = 0;
    dVar12 = dVar17;
    bVar3 = true;
    do {
      bVar7 = bVar3;
      dVar17 = ABS(pdVar6[lVar9]);
      if (ABS(pdVar6[lVar9]) <= dVar12) {
        dVar17 = dVar12;
      }
      lVar9 = 1;
      dVar12 = dVar17;
      bVar3 = false;
    } while (bVar7);
    pdVar6 = local_128 + 2;
    bVar3 = false;
  } while (bVar4);
  if (dVar17 <= 1e-10) {
    local_138 = 0.0;
    dStack_130 = 1.0;
    local_f8 = (undefined1  [8])0x3ff0000000000000;
    dStack_f0 = 0.0;
    local_c8 = 0.0;
    dStack_c0 = 0.0;
  }
  else {
    auVar15._8_8_ = dVar17;
    auVar15._0_8_ = dVar17;
    auVar15 = divpd(in_stack_00000008,auVar15);
    local_128[0] = auVar15._0_8_;
    local_128[1] = auVar15._8_8_;
    auVar2._8_8_ = dVar17;
    auVar2._0_8_ = dVar17;
    auVar15 = divpd(in_stack_00000018,auVar2);
    local_128[2] = auVar15._0_8_;
    local_128[3] = auVar15._8_8_;
    dVar12 = local_128[3] + local_128[0];
    dStack_f0 = local_128[2];
    local_f8 = (undefined1  [8])local_128[1];
    local_100 = local_128[0];
    local_80 = local_128[3];
    dVar18 = (local_128[0] * local_128[3] - local_128[2] * local_128[1]) * -4.0 + dVar12 * dVar12;
    if (5e-05 <= ABS(dVar18)) {
      if (dVar18 <= 0.0) {
        uVar5 = 0x119;
        local_e0 = "nroots == 1 && roots_obj.mults[0] == 2";
LAB_0035ab5e:
        fail("assertion %s failed at %s +%d\n",local_e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
             ,uVar5);
      }
      dVar14 = SQRT(dVar18);
      dStack_d0 = 0.0;
      dVar11 = dVar14;
      local_d8 = dVar12;
      local_c8 = dVar17;
      dStack_c0 = dVar17;
      if (dVar18 < 0.0) {
        dVar11 = sqrt(dVar18);
      }
      dVar11 = dVar11 + local_d8;
      if (dVar18 < 0.0) {
        dVar14 = sqrt(dVar18);
      }
      local_d8 = (local_d8 - dVar14) * 0.5;
      uVar10 = local_f8._0_4_;
      uVar13 = local_f8._4_4_;
      local_f8 = local_f8._8_8_;
      register0x00001208 = uVar10;
      register0x0000120c = uVar13;
      pdVar6 = &local_a8;
      pdVar8 = &local_b8;
      local_e0 = "best_norm > EPSILON";
      dVar17 = dVar11 * 0.5;
      bVar3 = true;
      dStack_d0 = local_d8;
      do {
        bVar4 = bVar3;
        local_128[0] = local_100 - dVar17;
        dVar18 = local_80 - dVar17;
        local_128[1] = (double)local_f8;
        local_128[2] = dStack_f0;
        local_128[3] = dVar18;
        dVar12 = (double)local_f8 * (double)local_f8 + local_128[0] * local_128[0];
        if (dVar12 < 0.0) {
          dVar12 = sqrt(dVar12);
        }
        else {
          dVar12 = SQRT(dVar12);
        }
        dVar18 = dVar18 * dVar18 + local_128[2] * local_128[2];
        if (dVar18 < 0.0) {
          dVar18 = sqrt(dVar18);
        }
        else {
          dVar18 = SQRT(dVar18);
        }
        dVar11 = dVar18;
        if (dVar18 <= dVar12) {
          dVar11 = dVar12;
        }
        if (dVar11 <= 1e-10) {
          uVar5 = 0xd3;
          goto LAB_0035ab5e;
        }
        auVar16._8_8_ = dVar11;
        auVar16._0_8_ = dVar11;
        auVar15 = divpd(*(undefined1 (*) [16])(local_128 + (ulong)(dVar12 < dVar18) * 2),auVar16);
        *pdVar6 = -auVar15._8_8_;
        pdVar6[1] = auVar15._0_8_;
        *pdVar8 = dVar17;
        pdVar8 = &dStack_b0;
        pdVar6 = &local_98;
        dVar17 = local_d8;
        bVar3 = false;
      } while (bVar4);
      uVar10 = SUB84(dStack_b0,0);
      uVar13 = (undefined4)((ulong)dStack_b0 >> 0x20);
      dVar12 = local_b8;
    }
    else {
      dVar12 = dVar12 * 0.5;
      local_a8 = 1.0;
      dStack_a0 = 0.0;
      local_98 = 0.0;
      dStack_90 = 1.0;
      uVar10 = SUB84(dVar12,0);
      uVar13 = (undefined4)((ulong)dVar12 >> 0x20);
      local_c8 = dVar17;
      dStack_c0 = dVar17;
    }
    local_f8 = (undefined1  [8])local_a8;
    dStack_f0 = dStack_a0;
    local_138 = local_98;
    dStack_130 = dStack_90;
    local_c8 = local_c8 * dVar12;
    dStack_c0 = dStack_c0 * (double)CONCAT44(uVar13,uVar10);
  }
  local_100 = exp(local_c8);
  local_128[3] = exp(dStack_c0);
  local_128[0] = local_100;
  local_128[1] = 0.0;
  local_128[2] = 0.0;
  pdVar6 = &local_a8;
  pdVar8 = local_128;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    dVar17 = *pdVar8;
    dVar12 = pdVar8[1];
    *pdVar6 = dVar12 * local_138 + dVar17 * (double)local_f8;
    pdVar6[1] = dVar12 * dStack_130 + dVar17 * dStack_f0;
    pdVar6 = &local_b8;
    pdVar8 = local_128 + 2;
    bVar3 = false;
  } while (bVar4);
  local_128[0] = (double)local_f8;
  local_128[1] = dStack_f0;
  local_128[2] = local_138;
  local_128[3] = dStack_130;
  local_78 = (double)local_f8;
  local_70._8_4_ = SUB84(dStack_f0,0);
  local_70._0_8_ = local_138;
  local_70._12_4_ = (int)((ulong)dStack_f0 >> 0x20);
  local_60 = dStack_130;
  lVar9 = 0;
  pdVar6 = &local_78;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    dVar17 = *pdVar6;
    dVar12 = pdVar6[1];
    pVVar1 = (in_RDI->super_Few<Omega_h::Vector<2>,_2>).array_ + lVar9;
    (pVVar1->super_Few<double,_2>).array_[0] = dVar12 * local_b8 + dVar17 * local_a8;
    (pVVar1->super_Few<double,_2>).array_[1] = dVar12 * dStack_b0 + dVar17 * dStack_a0;
    lVar9 = 1;
    pdVar6 = (double *)(local_70 + 8);
    bVar3 = false;
  } while (bVar4);
  return in_RDI;
}

Assistant:

OMEGA_H_INLINE_BIG Tensor<dim> exp_spd_old(
    Tensor<dim> const m) OMEGA_H_NOEXCEPT {
  auto decomp = decompose_eigen(m);
  for (Int i = 0; i < dim; ++i) decomp.l[i] = std::exp(decomp.l[i]);
  return compose_ortho(decomp.q, decomp.l);
}